

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

uint32_t binary_fuse_calculate_segment_length(uint32_t arity,uint32_t size)

{
  uint in_ESI;
  int in_EDI;
  double dVar1;
  double dVar2;
  undefined4 local_4;
  
  if (in_EDI == 3) {
    dVar1 = log((double)in_ESI);
    dVar2 = log(3.33);
    dVar1 = floor(dVar1 / dVar2 + 2.25);
    local_4 = 1 << ((byte)(int)dVar1 & 0x1f);
  }
  else if (in_EDI == 4) {
    dVar1 = log((double)in_ESI);
    dVar2 = log(2.91);
    dVar1 = floor(dVar1 / dVar2 - 0.5);
    local_4 = 1 << ((byte)(int)dVar1 & 0x1f);
  }
  else {
    local_4 = 0x10000;
  }
  return local_4;
}

Assistant:

static inline uint32_t binary_fuse_calculate_segment_length(uint32_t arity,
                                                             uint32_t size) {
  // These parameters are very sensitive. Replacing 'floor' by 'round' can
  // substantially affect the construction time.
  if (arity == 3) {
    return ((uint32_t)1) << (int)(floor(log((double)(size)) / log(3.33) + 2.25));
  } else if (arity == 4) {
    return ((uint32_t)1) << (int)(floor(log((double)(size)) / log(2.91) - 0.5));
  } else {
    return 65536;
  }
}